

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_lcp.cpp
# Opt level: O1

void merge_cache_lcp_2way<true,unsigned_int>
               (uchar **from0,lcp_t *lcp_input0,uint *cache_input0,size_t n0,uchar **from1,
               lcp_t *lcp_input1,uint *cache_input1,size_t n1,uchar **result,lcp_t *lcp_result,
               uint *cache_result)

{
  byte bVar1;
  uchar *puVar2;
  char *pcVar3;
  uchar **ppuVar4;
  uint *puVar5;
  ulong *puVar6;
  size_t sVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  size_t sVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  ulong *puVar15;
  uchar **ppuVar16;
  uint *puVar17;
  lcp_t lcp0;
  uchar **ppuVar18;
  uchar **ppuVar19;
  uint *puVar20;
  ulong uVar21;
  uint uVar22;
  ulong *puVar23;
  uint *puVar24;
  uint *puVar25;
  lcp_t lVar26;
  uchar *puVar27;
  ulong lcp1;
  long lVar28;
  ulong uVar29;
  uint *local_60;
  uint *local_50;
  ulong *local_48;
  ulong local_40;
  int local_38;
  
  check_input<unsigned_int>(from0,lcp_input0,cache_input0,n0);
  check_input<unsigned_int>(from1,lcp_input1,cache_input1,n1);
  local_60 = cache_input0 + 1;
  uVar22 = *cache_input0;
  puVar20 = cache_input1 + 1;
  uVar10 = *cache_input1;
  uVar21 = (ulong)uVar10;
  if (uVar22 < uVar10) {
    puVar2 = *from0;
    if (puVar2 == (uchar *)0x0) {
LAB_001d1c59:
      __assert_fail("a != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x51,"int cmp(const unsigned char *, const unsigned char *)");
    }
    puVar27 = *from1;
    if (puVar27 == (uchar *)0x0) {
LAB_001d1c78:
      __assert_fail("b != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x52,"int cmp(const unsigned char *, const unsigned char *)");
    }
    iVar8 = strcmp((char *)puVar2,(char *)puVar27);
    if (-1 < iVar8) {
      __assert_fail("cmp(*from0, *from1) < 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x449,
                    "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned int]"
                   );
    }
    if (uVar22 == uVar10) {
LAB_001d1cb6:
      __assert_fail("a != b or a==0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x3ff,"unsigned int lcp(uint32_t, uint32_t)");
    }
    uVar9 = 0;
    if (((uVar22 & 0xff000000) == (uVar10 & 0xff000000) && (uVar22 & 0xff000000) != 0) &&
       (uVar9 = 1, (uVar22 & 0xff0000) == (uVar10 & 0xff0000) && (uVar22 & 0xff0000) != 0)) {
      uVar9 = ((uVar22 & 0xff00) == (uVar10 & 0xff00) && (uVar22 & 0xff00) != 0) | 2;
    }
    uVar13 = (ulong)uVar9;
    if (uVar9 != 0) {
      bVar1 = puVar27[uVar13];
      if (bVar1 == 0) {
        uVar21 = 0;
      }
      else {
        uVar21 = (ulong)bVar1 << 0x18;
        if (puVar27[uVar13 + 1] != 0) {
          uVar10 = (uint)puVar27[uVar13 + 1] << 0x10 | (uint)bVar1 << 0x18;
          if (puVar27[uVar13 + 2] == '\0') {
            uVar21 = (ulong)uVar10;
          }
          else {
            uVar21 = (ulong)(CONCAT11(puVar27[uVar13 + 2],puVar27[uVar13 + 3]) | uVar10);
          }
        }
      }
    }
    uVar10 = (uint)uVar21;
    *result = puVar2;
    ppuVar19 = result + 1;
    *cache_result = uVar22;
    puVar25 = cache_result + 1;
    if (n0 - 1 == 0) {
LAB_001d18ec:
      n0 = 0;
LAB_001d1900:
      local_60 = puVar20;
      if (n0 != 0) {
        __assert_fail("n0==0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                      ,0x51d,
                      "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned int]"
                     );
      }
      if (n1 == 0) {
        __assert_fail("n1",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                      ,0x51e,
                      "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned int]"
                     );
      }
      *lcp_result = uVar13;
      *puVar25 = uVar10;
      memmove(ppuVar19,from1,n1 * 8);
      memmove(lcp_result + 1,lcp_input1,n1 * 8);
      n0 = n1;
      goto LAB_001d1956;
    }
    lcp0 = *lcp_input0;
    uVar22 = cache_input0[1];
    ppuVar4 = from0 + 1;
    puVar5 = cache_input0 + 2;
    puVar6 = lcp_input0 + 1;
    sVar7 = n0 - 1;
LAB_001d0f1d:
    do {
      while( true ) {
        while( true ) {
          n0 = sVar7;
          puVar24 = puVar25;
          puVar23 = puVar6;
          ppuVar18 = ppuVar19;
          puVar17 = puVar5;
          ppuVar16 = ppuVar4;
          puVar15 = lcp_result;
          lVar28 = 0;
          lVar12 = 0;
          from0 = ppuVar16;
          lcp_input0 = puVar23;
          sVar11 = n0;
          lcp1 = uVar13;
          local_60 = puVar17;
          local_50 = puVar24;
          local_48 = puVar15;
          while( true ) {
            sVar11 = sVar11 - 1;
            uVar29 = (ulong)uVar22;
            uVar13 = lcp1;
            check_lcp_and_cache<unsigned_int>
                      (*(uchar **)((long)ppuVar18 + lVar12 + -8),
                       *(uchar **)((long)ppuVar16 + lVar12),lcp0,uVar22,*from1,lcp1,(uint)uVar21);
            uVar10 = (uint)uVar21;
            uVar22 = (uint)uVar29;
            if (lcp0 <= lcp1) break;
            pcVar3 = *(char **)((long)ppuVar16 + lVar12);
            if (pcVar3 == (char *)0x0) goto LAB_001d1c59;
            if (*from1 == (uchar *)0x0) goto LAB_001d1c78;
            iVar8 = strcmp(pcVar3,(char *)*from1);
            uVar10 = (uint)uVar21;
            if (-1 < iVar8) {
              __assert_fail("cmp(*from0, *from1) < 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                            ,0x4ae,
                            "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned int]"
                           );
            }
            *(char **)((long)ppuVar18 + lVar12) = pcVar3;
            from0 = from0 + 1;
            local_48 = local_48 + 1;
            *(lcp_t *)((long)puVar15 + lVar12) = lcp0;
            local_50 = local_50 + 1;
            *(uint *)((long)puVar24 + lVar28) = uVar22;
            lcp_input0 = lcp_input0 + 1;
            lcp0 = *(lcp_t *)((long)puVar23 + lVar12);
            local_60 = local_60 + 1;
            uVar22 = *(uint *)((long)puVar17 + lVar28);
            n0 = n0 - 1;
            lVar12 = lVar12 + 8;
            lVar28 = lVar28 + 4;
            lcp1 = uVar13;
            if (sVar11 == 0) {
              ppuVar19 = (uchar **)((long)ppuVar18 + lVar12);
              lcp_result = (lcp_t *)((long)puVar15 + lVar12);
              puVar25 = (uint *)((long)puVar24 + lVar28);
              goto LAB_001d18e3;
            }
          }
          if (lcp1 <= lcp0) break;
          if (*(char **)((long)ppuVar16 + lVar12) == (char *)0x0) goto LAB_001d1c59;
          puVar2 = *from1;
          if (puVar2 == (uchar *)0x0) goto LAB_001d1c78;
          iVar8 = strcmp(*(char **)((long)ppuVar16 + lVar12),(char *)puVar2);
          if (iVar8 < 1) {
            __assert_fail("cmp(*from0, *from1) > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                          ,0x4b7,
                          "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned int]"
                         );
          }
          *(undefined8 *)((long)ppuVar18 + lVar12) = puVar2;
          *(ulong *)((long)puVar15 + lVar12) = uVar13;
          from1 = from1 + 1;
          *(uint *)((long)puVar24 + lVar28) = uVar10;
          uVar13 = *lcp_input1;
          lcp_input1 = lcp_input1 + 1;
          uVar21 = (ulong)*puVar20;
          puVar20 = puVar20 + 1;
          n1 = n1 - 1;
          lcp_result = (ulong *)((long)puVar15 + lVar12) + 1;
          ppuVar4 = (uchar **)((long)ppuVar16 + lVar12);
          puVar5 = (uint *)((long)puVar17 + lVar28);
          ppuVar19 = (uchar **)((undefined8 *)((long)ppuVar18 + lVar12) + 1);
          puVar6 = (ulong *)((long)puVar23 + lVar12);
          puVar25 = (uint *)((long)puVar24 + lVar28) + 1;
          sVar7 = sVar11 + 1;
          if (n1 == 0) {
            lcp_result = local_48 + 1;
            puVar25 = local_50 + 1;
            ppuVar19 = (uchar **)((long)ppuVar18 + lVar12 + 8);
            n1 = 0;
            goto LAB_001d1be8;
          }
        }
        if (uVar10 <= uVar22) break;
        pcVar3 = *(char **)((long)ppuVar16 + lVar12);
        if (pcVar3 == (char *)0x0) goto LAB_001d1c59;
        puVar2 = *from1;
        if (puVar2 == (uchar *)0x0) goto LAB_001d1c78;
        iVar8 = strcmp(pcVar3,(char *)puVar2);
        if (-1 < iVar8) {
          __assert_fail("cmp(*from0, *from1) < 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                        ,0x4c6,
                        "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned int]"
                       );
        }
        uVar10 = 0;
        uVar22 = (uint)uVar29;
        if (((uVar29 & 0xff000000) != 0) &&
           (uVar9 = (uint)uVar21, (uVar22 & 0xff000000) == (uVar9 & 0xff000000))) {
          uVar10 = 1;
          if (((uVar29 & 0xff0000) != 0) && ((uVar22 & 0xff0000) == (uVar9 & 0xff0000))) {
            uVar10 = ((uVar22 & 0xff00) == (uVar9 & 0xff00) && (uVar29 & 0xff00) != 0) | 2;
          }
        }
        if (uVar10 != 0) {
          uVar13 = uVar13 + uVar10;
          bVar1 = puVar2[uVar13];
          if (bVar1 == 0) {
            uVar21 = 0;
          }
          else {
            uVar21 = (ulong)bVar1 << 0x18;
            if (puVar2[uVar13 + 1] != 0) {
              uVar10 = (uint)bVar1 << 0x18 | (uint)puVar2[uVar13 + 1] << 0x10;
              uVar21 = (ulong)uVar10;
              if (puVar2[uVar13 + 2] != '\0') {
                uVar21 = (ulong)(uVar10 | CONCAT11(puVar2[uVar13 + 2],puVar2[uVar13 + 3]));
              }
            }
          }
        }
        uVar10 = (uint)uVar21;
        *(char **)((long)ppuVar18 + lVar12) = pcVar3;
        *(lcp_t *)((long)puVar15 + lVar12) = lcp0;
        *(uint *)((long)puVar24 + lVar28) = uVar22;
        ppuVar19 = (uchar **)((long)ppuVar18 + lVar12 + 8);
        if (sVar11 == 0) {
          lcp_result = (lcp_t *)((long)puVar15 + lVar12 + 8);
          puVar25 = (uint *)((long)puVar24 + lVar28 + 4);
LAB_001d18e3:
          n0 = 0;
          goto LAB_001d1900;
        }
        lcp0 = *(ulong *)((long)puVar23 + lVar12);
LAB_001d132e:
        uVar22 = *(uint *)((long)puVar17 + lVar28);
        lcp_result = (ulong *)((long)puVar15 + lVar12 + 8);
        ppuVar4 = (uchar **)((long)ppuVar16 + lVar12 + 8);
        puVar5 = (uint *)((long)puVar17 + lVar28) + 1;
        puVar6 = (ulong *)((long)puVar23 + lVar12 + 8);
        puVar25 = (uint *)((long)puVar24 + lVar28 + 4);
        sVar7 = sVar11;
      }
      if (uVar22 <= uVar10) {
        if ((char)uVar29 == '\0') {
          pcVar3 = *(char **)((long)ppuVar16 + lVar12);
          if (pcVar3 != (char *)0x0) {
            if (*from1 != (uchar *)0x0) {
              iVar8 = strcmp(pcVar3,(char *)*from1);
              if (iVar8 != 0) {
                __assert_fail("cmp(*from0, *from1) == 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                              ,0x4e7,
                              "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned int]"
                             );
              }
              *(char **)((long)ppuVar18 + lVar12) = pcVar3;
              *(lcp_t *)((long)puVar15 + lVar12) = lcp0;
              uVar22 = (uint)uVar29;
              *(uint *)((long)puVar24 + lVar28) = uVar22;
              lcp0 = *(ulong *)((long)puVar23 + lVar12);
              if ((uVar22 == 0) || (uVar22 != uVar10)) {
                if ((uVar29 & 0xff000000) == 0) {
                  uVar21 = 0;
                }
                else {
                  uVar21 = 0;
                  if ((uVar22 & 0xff000000) == (uVar10 & 0xff000000)) {
                    uVar21 = 1;
                    if (((uVar29 & 0xff0000) != 0) && ((uVar22 & 0xff0000) == (uVar10 & 0xff0000)))
                    {
                      uVar21 = (ulong)((uVar22 & 0xff00) == (uVar10 & 0xff00) &&
                                      (uVar29 & 0xff00) != 0) | 2;
                    }
                  }
                }
                uVar13 = uVar13 + uVar21;
                if (sVar11 != 0) {
                  ppuVar19 = (uchar **)((long)ppuVar18 + lVar12 + 8);
                  uVar21 = 0;
                  goto LAB_001d132e;
                }
                ppuVar19 = (uchar **)((long)ppuVar18 + lVar12 + 8);
                lcp_result = (lcp_t *)((long)puVar15 + lVar12 + 8);
                puVar25 = (uint *)((long)puVar24 + lVar28 + 4);
                uVar10 = 0;
                goto LAB_001d18e3;
              }
              goto LAB_001d1cb6;
            }
            goto LAB_001d1c78;
          }
          goto LAB_001d1c59;
        }
        from0 = (uchar **)((long)ppuVar16 + lVar12);
        lVar14 = lVar12;
        lVar26 = lcp0;
        compare((uchar *)&local_40,*(uchar **)((long)ppuVar16 + lVar12),(size_t)*from1);
        n0 = sVar11 + 1;
        local_60 = (uint *)((long)puVar17 + lVar28);
        lcp_input0 = (lcp_t *)((long)puVar23 + lVar12);
        uVar13 = local_40;
        if (local_38 < 0) {
          *(undefined8 *)((long)ppuVar18 + lVar12) = *(undefined8 *)((long)ppuVar16 + lVar12);
          *(lcp_t *)((long)puVar15 + lVar12) = lcp0;
          *(uint *)((long)puVar24 + lVar28) = uVar22;
          puVar2 = *from1;
          if (puVar2 == (uchar *)0x0) goto LAB_001d1dcd;
          bVar1 = puVar2[local_40];
          if (bVar1 == 0) {
            uVar21 = 0;
            lVar14 = lVar12;
          }
          else {
            uVar21 = (ulong)bVar1 << 0x18;
            if (puVar2[local_40 + 1] != 0) {
              uVar10 = (uint)puVar2[local_40 + 1] << 0x10 | (uint)bVar1 << 0x18;
              if (puVar2[local_40 + 2] == '\0') {
                uVar21 = (ulong)uVar10;
              }
              else {
                uVar21 = (ulong)(CONCAT11(puVar2[local_40 + 2],puVar2[local_40 + 3]) | uVar10);
              }
            }
          }
          from0 = (uchar **)((long)ppuVar16 + lVar14 + 8);
          ppuVar19 = (uchar **)((long)ppuVar18 + lVar14 + 8);
          lcp_result = (lcp_t *)((long)puVar15 + lVar14 + 8);
          puVar25 = (uint *)((long)puVar24 + lVar28 + 4);
          lcp_input0 = (lcp_t *)((long)puVar23 + lVar14 + 8);
          lcp0 = lcp_input0[-1];
          local_60 = (uint *)((long)puVar17 + lVar28) + 1;
          uVar22 = *(uint *)((long)puVar17 + lVar28);
          n0 = sVar11;
          if (sVar11 != 0) goto LAB_001d189d;
          iVar8 = 2;
          n0 = 0;
        }
        else {
          ppuVar19 = (uchar **)((long)ppuVar18 + lVar12 + 8);
          lcp_result = (lcp_t *)((long)puVar15 + lVar12 + 8);
          puVar25 = (uint *)((long)puVar24 + lVar28 + 4);
          if (local_38 == 0) {
            from0 = (uchar **)((undefined8 *)(lVar12 + (long)ppuVar16) + 1);
            *(undefined8 *)((long)ppuVar18 + lVar12) = *(undefined8 *)(lVar12 + (long)ppuVar16);
            *(lcp_t *)((long)puVar15 + lVar12) = lVar26;
            *(uint *)((long)puVar24 + lVar28) = uVar22;
            lcp_input0 = (lcp_t *)((long)puVar23 + lVar12 + 8);
            lcp0 = lcp_input0[-1];
            local_60 = (uint *)((long)puVar17 + lVar28) + 1;
            uVar22 = *(uint *)((long)puVar17 + lVar28);
            uVar21 = 0;
            n0 = sVar11;
            if (sVar11 != 0) goto LAB_001d189d;
            iVar8 = 2;
            n0 = 0;
          }
          else {
            *(uchar **)((long)ppuVar18 + lVar12) = *from1;
            *(lcp_t *)((long)puVar15 + lVar12) = lVar26;
            *(uint *)((long)puVar24 + lVar28) = uVar22;
            puVar2 = *from0;
            if (puVar2 == (uchar *)0x0) goto LAB_001d1dcd;
            if (puVar2[local_40] == 0) {
              uVar22 = 0;
            }
            else {
              uVar22 = (uint)puVar2[local_40] << 0x18;
              if (puVar2[local_40 + 1] != 0) {
                uVar22 = uVar22 | (uint)puVar2[local_40 + 1] << 0x10;
                if (puVar2[local_40 + 2] != '\0') {
                  uVar22 = uVar22 | CONCAT11(puVar2[local_40 + 2],puVar2[local_40 + 3]);
                }
              }
            }
            from1 = from1 + 1;
            uVar13 = *lcp_input1;
            lcp_input1 = lcp_input1 + 1;
            uVar21 = (ulong)*puVar20;
            puVar20 = puVar20 + 1;
            n1 = n1 - 1;
            lcp0 = local_40;
            if (n1 == 0) {
              iVar8 = 3;
              n1 = 0;
            }
            else {
LAB_001d189d:
              iVar8 = 0;
            }
          }
        }
        uVar10 = (uint)uVar21;
        ppuVar4 = from0;
        puVar5 = local_60;
        puVar6 = lcp_input0;
        sVar7 = n0;
        if (iVar8 != 0) {
          if (iVar8 == 1) {
            return;
          }
          if (iVar8 != 2) goto LAB_001d1be8;
          goto LAB_001d1900;
        }
        goto LAB_001d0f1d;
      }
      pcVar3 = *(char **)((long)ppuVar16 + lVar12);
      if (pcVar3 == (char *)0x0) goto LAB_001d1c59;
      puVar2 = *from1;
      if (puVar2 == (uchar *)0x0) goto LAB_001d1c78;
      iVar8 = strcmp(pcVar3,(char *)puVar2);
      if (iVar8 < 1) {
        __assert_fail("cmp(*from0, *from1) > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                      ,0x4d6,
                      "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned int]"
                     );
      }
      uVar9 = 0;
      uVar22 = (uint)uVar29;
      if (((uVar29 & 0xff000000) != 0) && ((uVar22 & 0xff000000) == (uVar10 & 0xff000000))) {
        uVar9 = 1;
        if (((uVar29 & 0xff0000) != 0) && ((uVar22 & 0xff0000) == (uVar10 & 0xff0000))) {
          uVar9 = ((uVar22 & 0xff00) == (uVar10 & 0xff00) && (uVar29 & 0xff00) != 0) | 2;
        }
      }
      if (uVar9 != 0) {
        lcp0 = lcp0 + uVar9;
        if (pcVar3[lcp0] == 0) {
          uVar22 = 0;
        }
        else {
          uVar22 = (uint)(byte)pcVar3[lcp0] << 0x18;
          if (pcVar3[lcp0 + 1] != 0) {
            uVar22 = uVar22 | (uint)(byte)pcVar3[lcp0 + 1] << 0x10;
            if (pcVar3[lcp0 + 2] != '\0') {
              uVar22 = uVar22 | CONCAT11(pcVar3[lcp0 + 2],pcVar3[lcp0 + 3]);
            }
          }
        }
      }
      from1 = from1 + 1;
      *(undefined8 *)((long)ppuVar18 + lVar12) = puVar2;
      lcp_result = (lcp_t *)((long)puVar15 + lVar12 + 8);
      lcp_result[-1] = uVar13;
      puVar25 = (uint *)((long)puVar24 + lVar28 + 4);
      puVar25[-1] = uVar10;
      uVar13 = *lcp_input1;
      lcp_input1 = lcp_input1 + 1;
      uVar21 = (ulong)*puVar20;
      puVar20 = puVar20 + 1;
      n1 = n1 - 1;
      ppuVar4 = (uchar **)((long)ppuVar16 + lVar12);
      puVar5 = (uint *)((long)puVar17 + lVar28);
      ppuVar19 = (uchar **)((undefined8 *)((long)ppuVar18 + lVar12) + 1);
      puVar6 = (ulong *)((long)puVar23 + lVar12);
      sVar7 = sVar11 + 1;
    } while (n1 != 0);
    ppuVar19 = (uchar **)((long)ppuVar18 + lVar12 + 8);
    lcp_result = (lcp_t *)((long)puVar15 + lVar12 + 8);
    puVar25 = (uint *)((long)puVar24 + lVar28 + 4);
    n0 = sVar11 + 1;
    local_60 = (uint *)((long)puVar17 + lVar28);
    lcp_input0 = (lcp_t *)((long)puVar23 + lVar12);
    from0 = (uchar **)((long)ppuVar16 + lVar12);
    n1 = 0;
  }
  else {
    if (uVar22 <= uVar10) {
      if ((char)uVar22 != '\0') {
        ppuVar19 = from1;
        compare((uchar *)&local_40,*from0,(size_t)*from1);
        uVar21 = local_40;
        if (local_38 < 0) {
          *result = *from0;
          *cache_result = uVar22;
          puVar2 = *from1;
          if (puVar2 == (uchar *)0x0) {
LAB_001d1dcd:
            __assert_fail("ptr",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                          ,0x38,"uint32_t get_char(unsigned char *, size_t)");
          }
          bVar1 = puVar2[local_40];
          if (bVar1 == 0) {
            uVar10 = 0;
          }
          else {
            uVar10 = (uint)bVar1 << 0x18;
            if (puVar2[local_40 + 1] != 0) {
              uVar10 = (uint)puVar2[local_40 + 1] << 0x10 | (uint)bVar1 << 0x18;
              if (puVar2[local_40 + 2] != '\0') {
                uVar10 = CONCAT11(puVar2[local_40 + 2],puVar2[local_40 + 3]) | uVar10;
              }
            }
          }
          local_40 = *lcp_input0;
          local_60 = cache_input0 + 2;
          if (n0 == 1) {
            lVar12 = 2;
            goto LAB_001d1aaf;
          }
        }
        else if (local_38 == 0) {
          *result = *from0;
          *cache_result = uVar22;
          local_40 = *lcp_input0;
          local_60 = cache_input0 + 2;
          uVar10 = 0;
          n0 = n0 - 1;
          from1 = ppuVar19;
          if (n0 == 0) {
            lVar12 = 2;
            goto LAB_001d1aaf;
          }
        }
        else {
          *result = *ppuVar19;
          *cache_result = uVar10;
          if (*from0 == (uchar *)0x0) goto LAB_001d1dcd;
          from1 = ppuVar19 + 1;
          uVar21 = *lcp_input1;
          lcp_input1 = lcp_input1 + 1;
          uVar10 = cache_input1[1];
          puVar20 = cache_input1 + 2;
          n1 = n1 - 1;
          if (n1 == 0) {
            n1 = 0;
            lVar12 = 3;
            ppuVar19 = from1;
            goto LAB_001d1aaf;
          }
        }
        lVar12 = 0;
        ppuVar19 = from1;
LAB_001d1aaf:
        (*(code *)((long)&DAT_001ed4e8 + (long)(int)(&DAT_001ed4e8)[lVar12]))
                  (local_60,uVar21,lVar12,&DAT_001ed4e8,result + 1,uVar10,ppuVar19,lcp_result,
                   local_40,cache_input0,n0,n1,cache_result,lcp_input1,lcp_input0,result,puVar20);
        return;
      }
      puVar2 = *from0;
      if (puVar2 == (uchar *)0x0) goto LAB_001d1c59;
      if (*from1 == (uchar *)0x0) goto LAB_001d1c78;
      iVar8 = strcmp((char *)puVar2,(char *)*from1);
      if (iVar8 != 0) {
        __assert_fail("cmp(*from0, *from1) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                      ,0x470,
                      "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned int]"
                     );
      }
      if (uVar22 != 0 && uVar22 == uVar10) goto LAB_001d1cb6;
      if ((uVar22 & 0xff000000) == (uVar10 & 0xff000000) && (uVar22 & 0xff000000) != 0) {
        uVar13 = 1;
        if ((uVar22 & 0xff0000) == (uVar10 & 0xff0000) && (uVar22 & 0xff0000) != 0) {
          uVar13 = (ulong)((uVar22 & 0xff00) == (uVar10 & 0xff00) && (uVar22 & 0xff00) != 0) | 2;
        }
      }
      else {
        uVar13 = 0;
      }
      *result = puVar2;
      ppuVar19 = result + 1;
      *cache_result = uVar22;
      puVar25 = cache_result + 1;
      if (n0 - 1 == 0) {
        uVar10 = 0;
        goto LAB_001d18ec;
      }
      lcp0 = *lcp_input0;
      uVar22 = cache_input0[1];
      uVar21 = 0;
      ppuVar4 = from0 + 1;
      puVar5 = cache_input0 + 2;
      puVar6 = lcp_input0 + 1;
      sVar7 = n0 - 1;
      goto LAB_001d0f1d;
    }
    puVar2 = *from0;
    if (puVar2 == (uchar *)0x0) goto LAB_001d1c59;
    puVar27 = *from1;
    if (puVar27 == (uchar *)0x0) goto LAB_001d1c78;
    iVar8 = strcmp((char *)puVar2,(char *)puVar27);
    if (iVar8 < 1) {
      __assert_fail("cmp(*from0, *from1) > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x45c,
                    "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned int]"
                   );
    }
    if (uVar22 == uVar10) goto LAB_001d1cb6;
    uVar9 = 0;
    if (((uVar22 & 0xff000000) == (uVar10 & 0xff000000) && (uVar22 & 0xff000000) != 0) &&
       (uVar9 = 1, (uVar22 & 0xff0000) == (uVar10 & 0xff0000) && (uVar22 & 0xff0000) != 0)) {
      uVar9 = ((uVar22 & 0xff00) == (uVar10 & 0xff00) && (uVar22 & 0xff00) != 0) | 2;
    }
    lcp0 = (lcp_t)uVar9;
    if (uVar9 != 0) {
      if (puVar2[lcp0] == 0) {
        uVar22 = 0;
      }
      else {
        uVar22 = (uint)puVar2[lcp0] << 0x18;
        if (puVar2[lcp0 + 1] != 0) {
          uVar22 = uVar22 | (uint)puVar2[lcp0 + 1] << 0x10;
          if (puVar2[lcp0 + 2] != '\0') {
            uVar22 = uVar22 | CONCAT11(puVar2[lcp0 + 2],puVar2[lcp0 + 3]);
          }
        }
      }
    }
    *result = puVar27;
    ppuVar19 = result + 1;
    *cache_result = uVar10;
    puVar25 = cache_result + 1;
    n1 = n1 - 1;
    if (n1 != 0) {
      from1 = from1 + 1;
      uVar13 = *lcp_input1;
      lcp_input1 = lcp_input1 + 1;
      uVar21 = (ulong)cache_input1[1];
      puVar20 = cache_input1 + 2;
      ppuVar4 = from0;
      puVar5 = local_60;
      puVar6 = lcp_input0;
      sVar7 = n0;
      goto LAB_001d0f1d;
    }
    n1 = 0;
  }
LAB_001d1be8:
  if (n0 == 0) {
    __assert_fail("n0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                  ,0x527,
                  "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned int]"
                 );
  }
  if (n1 != 0) {
    __assert_fail("n1==0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                  ,0x528,
                  "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned int]"
                 );
  }
  *lcp_result = lcp0;
  *puVar25 = uVar22;
  memmove(ppuVar19,from0,n0 * 8);
  memmove(lcp_result + 1,lcp_input0,n0 * 8);
LAB_001d1956:
  memmove(puVar25 + 1,local_60,n0 << 2);
  return;
}

Assistant:

void
merge_cache_lcp_2way(
       unsigned char** from0,  lcp_t* restrict lcp_input0, CharT* restrict cache_input0, size_t n0,
       unsigned char** from1,  lcp_t* restrict lcp_input1, CharT* restrict cache_input1, size_t n1,
       unsigned char** result, lcp_t* restrict lcp_result, CharT* restrict cache_result)
{
	debug() << __func__ << "(): n0=" << n0 << ", n1=" << n1 << '\n';

	check_input(from0, lcp_input0, cache_input0, n0);
	check_input(from1, lcp_input1, cache_input1, n1);

	lcp_t lcp0=0, lcp1=0;
	CharT cache0 = *cache_input0++;
	CharT cache1 = *cache_input1++;
	{
		stat_try_cache();
		if (cache0 < cache1) {
			assert(cmp(*from0, *from1) < 0);
			if (sizeof(CharT) > 1) {
				const int l = lcp(cache0, cache1);
				if (l > 0) {
					cache1 = get_char<CharT>(*from1, l);
				}
				*result++ = *from0++;
				if (OutputLCP) *cache_result++ = cache0;
				lcp0 = *lcp_input0++;
				lcp1 = l;
				cache0 = *cache_input0++;
			} else {
				*result++ = *from0++;
				if (OutputLCP) *cache_result++ = cache0;
				lcp0 = *lcp_input0++;
				cache0 = *cache_input0++;
			}
			if (--n0 == 0) goto finish0;
		} else if (cache0 > cache1) {
			assert(cmp(*from0, *from1) > 0);
			if (sizeof(CharT) > 1) {
				const int l = lcp(cache0, cache1);
				if (l > 0) {
					cache0 = get_char<CharT>(*from0, l);
				}
				*result++ = *from1++;
				if (OutputLCP) *cache_result++ = cache1;
				lcp0 = l;
				lcp1 = *lcp_input1++;
				cache1 = *cache_input1++;
			} else {
				*result++ = *from1++;
				if (OutputLCP) *cache_result++ = cache1;
				lcp1 = *lcp_input1++;
				cache1 = *cache_input1++;
			}
			if (--n1 == 0) goto finish1;
		} else {
			if (is_end(cache0)) {
				assert(cmp(*from0, *from1) == 0);
				if (sizeof(CharT) > 1) {
					const int l = lcp(cache0, cache1);
					*result++ = *from0++;
					if (OutputLCP) *cache_result++ = cache0;
					lcp0 = *lcp_input0++;
					lcp1 = l;
					cache0 = *cache_input0++;
					cache1 = 0;
				} else {
					*result++ = *from0++;
					if (OutputLCP) *cache_result++ = cache0;
					lcp0 = *lcp_input0++;
					cache0 = *cache_input0++;
					cache1 = 0;
				}
				if (--n0 == 0) goto finish0;
			} else {
				stat_cache_useless();
				int cmp01; lcp_t lcp01;
				std::tie(cmp01, lcp01) = compare(*from0, *from1, sizeof(CharT));
				if (cmp01 < 0) {
					*result++ = *from0++;
					if (OutputLCP) *cache_result++ = cache0;
					lcp0 = *lcp_input0++;
					lcp1 = lcp01;
					cache0 = *cache_input0++;
					cache1 = get_char<CharT>(*from1, lcp01);
					if (--n0 == 0) goto finish0;
				} else if (cmp01 == 0) {
					*result++ = *from0++;
					if (OutputLCP) *cache_result++ = cache0;
					lcp0 = *lcp_input0++;
					lcp1 = lcp01;
					cache0 = *cache_input0++;
					cache1 = 0;
					if (--n0 == 0) goto finish0;
				} else {
					*result++ = *from1++;
					if (OutputLCP) *cache_result++ = cache1;
					lcp0 = lcp01;
					lcp1 = *lcp_input1++;
					cache0 = get_char<CharT>(*from0, lcp01);
					cache1 = *cache_input1++;
					if (--n1 == 0) goto finish1;
				}
			}
		}
	}
	while (true) {
		debug() << "Starting loop, n0="<<n0<<", n1="<<n1<<" ...\n"
			<< "\tprev   = '"<<*(result-1)<<"'\n"
			<< "\t*from0 = '"<<*from0<<"'\n"
			<< "\t*from1 = '"<<*from1<<"'\n"
			<< "\tlcp0   = " <<lcp0<<"\n"
			<< "\tlcp1   = " <<lcp1<<"\n"
			<< "\tcache0 = '"<<to_str(cache0)<<"'\n"
			<< "\tcache1 = '"<<to_str(cache1)<<"'\n"
			<< "\n";
		check_lcp_and_cache(*(result-1),*from0,lcp0,cache0,*from1,lcp1,cache1);
		if (lcp0 > lcp1) {
			debug() << "\tlcp0 > lcp1\n";
			assert(cmp(*from0, *from1) < 0);
			*result++ = *from0++;
			if (OutputLCP) *lcp_result++ = lcp0;
			if (OutputLCP) *cache_result++ = cache0;
			lcp0 = *lcp_input0++;
			cache0 = *cache_input0++;
			if (--n0 == 0) goto finish0;
		} else if (lcp0 < lcp1) {
			debug() << "\tlcp0 < lcp1\n";
			assert(cmp(*from0, *from1) > 0);
			*result++ = *from1++;
			if (OutputLCP) *lcp_result++ = lcp1;
			if (OutputLCP) *cache_result++ = cache1;
			lcp1 = *lcp_input1++;
			cache1 = *cache_input1++;
			if (--n1 == 0) goto finish1;
		} else {
			debug() << "\tlcp0 == lcp1\n";
			stat_try_cache();
			// Both strings in the sorted sequences have the same
			// prefix than the latest string in output. Check
			// cached characters first.
			if (cache0 < cache1) {
				debug() << "\t\tcache0 < cache1\n";
				assert(cmp(*from0, *from1) < 0);
				if (sizeof(CharT) > 1) {
					const int l = lcp(cache0, cache1);
					if (l > 0) {
						lcp1 += l;
						cache1 = get_char<CharT>(*from1, lcp1);
					}
				}
				*result++ = *from0++;
				if (OutputLCP) *lcp_result++ = lcp0;
				if (OutputLCP) *cache_result++ = cache0;
				lcp0 = *lcp_input0++;
				cache0 = *cache_input0++;
				if (--n0 == 0) goto finish0;
			} else if (cache0 > cache1) {
				debug() << "\t\tcache0 > cache1\n";
				assert(cmp(*from0, *from1) > 0);
				if (sizeof(CharT) > 1) {
					const int l = lcp(cache0, cache1);
					if (l > 0) {
						lcp0 += l;
						cache0 = get_char<CharT>(*from0, lcp0);
					}
				}
				*result++ = *from1++;
				if (OutputLCP) *lcp_result++ = lcp1;
				if (OutputLCP) *cache_result++ = cache1;
				lcp1 = *lcp_input1++;
				cache1 = *cache_input1++;
				if (--n1 == 0) goto finish1;
			} else {
				debug() << "\t\tcache0 == cache1\n";
				if (is_end(cache0)) {
					assert(cmp(*from0, *from1) == 0);
					if (sizeof(CharT) > 1) {
						*result++ = *from0++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = *lcp_input0++;
						lcp1 += lcp(cache0, cache1);
						cache0 = *cache_input0++;
						cache1 = 0;
					} else {
						*result++ = *from0++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = *lcp_input0++;
						cache0 = *cache_input0++;
					}
					if (--n0 == 0) goto finish0;
				} else {
					stat_cache_useless();
					int cmp01; lcp_t lcp01;
					std::tie(cmp01, lcp01) = compare(*from0, *from1, lcp0+sizeof(CharT));
					if (cmp01 < 0) {
						*result++ = *from0++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = *lcp_input0++;
						lcp1 = lcp01;
						cache0 = *cache_input0++;
						cache1 = get_char<CharT>(*from1, lcp01);
						if (--n0 == 0) goto finish0;
					} else if (cmp01 == 0) {
						*result++ = *from0++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = *lcp_input0++;
						lcp1 = lcp01;
						cache0 = *cache_input0++;
						cache1 = 0;
						if (--n0 == 0) goto finish0;
					} else {
						*result++ = *from1++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = lcp01;
						lcp1 = *lcp_input1++;
						cache0 = get_char<CharT>(*from0, lcp01);
						cache1 = *cache_input1++;
						if (--n1 == 0) goto finish1;
					}
				}
			}
		}
	}
finish0:
	assert(n0==0);
	assert(n1);
	if (OutputLCP) *lcp_result++ = lcp1;
	if (OutputLCP) *cache_result++ = cache1;
	std::copy(from1, from1+n1, result);
	if (OutputLCP) std::copy(lcp_input1, lcp_input1+n1, lcp_result);
	if (OutputLCP) std::copy(cache_input1, cache_input1+n1, cache_result);
	debug() << '~' << __func__ << '\n';
	return;
finish1:
	assert(n0);
	assert(n1==0);
	if (OutputLCP) *lcp_result++ = lcp0;
	if (OutputLCP) *cache_result++ = cache0;
	std::copy(from0, from0+n0, result);
	if (OutputLCP) std::copy(lcp_input0, lcp_input0+n0, lcp_result);
	if (OutputLCP) std::copy(cache_input0, cache_input0+n0, cache_result);
	debug() << '~' << __func__ << '\n';
	return;
}